

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O1

void Res_SimCollectPatterns(Res_Sim_t *p,int fVerbose)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  ulong uVar11;
  
  pAVar4 = p->pAig;
  iVar2 = pAVar4->vPos->nSize;
  if (0 < iVar2) {
    ppvVar5 = pAVar4->vPos->pArray;
    iVar3 = *(int *)((long)*ppvVar5 + 0x10);
    if (-1 < (long)iVar3) {
      pVVar6 = p->vPats;
      if ((iVar3 < pVVar6->nSize) && (iVar2 != 1)) {
        iVar2 = *(int *)((long)ppvVar5[1] + 0x10);
        if ((-1 < (long)iVar2) && (iVar2 < pVVar6->nSize)) {
          if (0 < p->nBytesIn) {
            ppvVar5 = pVVar6->pArray;
            pvVar7 = ppvVar5[iVar3];
            pvVar8 = ppvVar5[iVar2];
            lVar10 = 0;
            do {
              if (*(char *)((long)pvVar7 + lVar10) != '\0') {
                if (*(char *)((long)pvVar8 + lVar10) == '\0') {
                  if (p->nPats0 < p->nPats) {
                    pVVar9 = pAVar4->vPis;
                    if (0 < pVVar9->nSize) {
                      uVar11 = 0;
                      do {
                        if (uVar11 == (uint)p->nTruePis) break;
                        iVar2 = *(int *)((long)pVVar9->pArray[uVar11] + 0x10);
                        if (((long)iVar2 < 0) || (pVVar6->nSize <= iVar2)) goto LAB_00467764;
                        if (*(char *)((long)ppvVar5[iVar2] + lVar10) != '\0') {
                          if (*(char *)((long)ppvVar5[iVar2] + lVar10) != -1) {
                            __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                                          ,0x287,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
                          }
                          if ((long)p->vPats0->nSize <= (long)uVar11) goto LAB_00467764;
                          puVar1 = (uint *)((long)p->vPats0->pArray[uVar11] +
                                           (long)(p->nPats0 >> 5) * 4);
                          *puVar1 = *puVar1 | 1 << ((byte)p->nPats0 & 0x1f);
                        }
                        uVar11 = uVar11 + 1;
                      } while ((long)uVar11 < (long)pVVar9->nSize);
                    }
                    p->nPats0 = p->nPats0 + 1;
                    goto LAB_004676f4;
                  }
                }
                else {
                  if (*(char *)((long)pvVar8 + lVar10) != -1) {
                    __assert_fail("pInfoNode[i] == 0 || pInfoNode[i] == 0xff",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                                  ,0x27d,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
                  }
                  if (p->nPats1 < p->nPats) {
                    pVVar9 = pAVar4->vPis;
                    if (0 < pVVar9->nSize) {
                      uVar11 = 0;
                      do {
                        if (uVar11 == (uint)p->nTruePis) break;
                        iVar2 = *(int *)((long)pVVar9->pArray[uVar11] + 0x10);
                        if (((long)iVar2 < 0) || (pVVar6->nSize <= iVar2)) goto LAB_00467764;
                        if (*(char *)((long)ppvVar5[iVar2] + lVar10) != '\0') {
                          if (*(char *)((long)ppvVar5[iVar2] + lVar10) != -1) {
                            __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                                          ,0x296,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
                          }
                          if ((long)p->vPats1->nSize <= (long)uVar11) goto LAB_00467764;
                          puVar1 = (uint *)((long)p->vPats1->pArray[uVar11] +
                                           (long)(p->nPats1 >> 5) * 4);
                          *puVar1 = *puVar1 | 1 << ((byte)p->nPats1 & 0x1f);
                        }
                        uVar11 = uVar11 + 1;
                      } while ((long)uVar11 < (long)pVVar9->nSize);
                    }
                    p->nPats1 = p->nPats1 + 1;
LAB_004676f4:
                    if ((p->nPats <= p->nPats0) && (p->nPats <= p->nPats1)) break;
                  }
                }
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < p->nBytesIn);
          }
          if (fVerbose != 0) {
            printf("|  ");
            printf("On = %3d  ",(ulong)(uint)p->nPats1);
            printf("Off = %3d  ",(ulong)(uint)p->nPats0);
            putchar(10);
            return;
          }
          return;
        }
      }
    }
  }
LAB_00467764:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Res_SimCollectPatterns( Res_Sim_t * p, int fVerbose )
{
    Abc_Obj_t * pObj;
    unsigned char * pInfoCare, * pInfoNode, * pInfo;
    int i, j;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        // skip don't-care patterns
        if ( !pInfoCare[i] )
            continue;
        // separate offset and onset patterns
        assert( pInfoNode[i] == 0 || pInfoNode[i] == 0xff );
        if ( !pInfoNode[i] )
        {
            if ( p->nPats0 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats0, j), p->nPats0 );
            }
            p->nPats0++;
        }
        else
        {
            if ( p->nPats1 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats1, j), p->nPats1 );
            }
            p->nPats1++;
        }
        if ( p->nPats0 >= p->nPats && p->nPats1 >= p->nPats )
            break;
    }
    if ( fVerbose )
    {
        printf( "|  " );
        printf( "On = %3d  ", p->nPats1 );
        printf( "Off = %3d  ", p->nPats0 );
        printf( "\n" );
    }
}